

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

int NGA_Sprs_array_get_block64
              (int s_a,int64_t irow,int64_t icol,int64_t **idx,int64_t **jdx,void **data,
              int64_t *ilo,int64_t *ihi,int64_t *jlo,int64_t *jhi)

{
  logical lVar1;
  undefined8 *in_RCX;
  undefined8 *in_R8;
  long *in_stack_00000008;
  long *in_stack_00000010;
  long *in_stack_00000018;
  long *in_stack_00000020;
  int ret;
  void *jd;
  void *id;
  Integer jh;
  Integer jl;
  Integer ih;
  Integer il;
  Integer ic;
  Integer ir;
  Integer sa;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  
  lVar1 = pnga_sprs_array_get_block
                    (ic,il,ih,(void **)jl,(void **)jh,(void **)id,(Integer *)data,(Integer *)jdx,
                     (Integer *)idx,(Integer *)icol);
  *in_stack_00000008 = local_58 + -1;
  *in_stack_00000010 = local_60 + -1;
  *in_stack_00000018 = local_68 + -1;
  *in_stack_00000020 = local_70 + -1;
  *in_RCX = local_78;
  *in_R8 = local_80;
  return (int)lVar1;
}

Assistant:

int NGA_Sprs_array_get_block64(int s_a, int64_t irow, int64_t icol,
    int64_t **idx, int64_t **jdx, void **data, int64_t *ilo,
    int64_t *ihi, int64_t *jlo, int64_t *jhi)
{
  Integer sa = (Integer)s_a;
  Integer ir = (Integer)irow;
  Integer ic = (Integer)icol;
  Integer il, ih, jl, jh;
  void *id, *jd;
  int ret = wnga_sprs_array_get_block(sa, ir, ic, &id, &jd, data,
      &il, &ih, &jl, &jh);
  *ilo = (int64_t)il-1;
  *ihi = (int64_t)ih-1;
  *jlo = (int64_t)jl-1;
  *jhi = (int64_t)jh-1;
  *idx = (int64_t*)id;
  *jdx = (int64_t*)jd;
  return ret;
}